

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TempTracker.cpp
# Opt level: O1

bool __thiscall
NumberTemp::IsTempIndirTransferLoad(NumberTemp *this,Instr *instr,BackwardPass *backwardPass)

{
  Opnd *this_00;
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  byte bVar4;
  undefined4 *puVar5;
  ulong uVar6;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_1a;
  
  bVar2 = BackwardPass::DoMarkTempNumbersOnTempObjects(backwardPass);
  if ((bVar2) && ((this->nonTempElemLoad & 1U) == 0)) {
    this_00 = instr->m_src1;
    if (instr->m_opcode == LdElemI_A) {
      OVar3 = IR::Opnd::GetKind(this_00);
      if (OVar3 != OpndKindIndir) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
        if (!bVar2) {
LAB_00638ce8:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
      }
      uVar6 = *(ulong *)&this_00[1].m_valueType;
      if (uVar6 == 0) {
LAB_00638c5c:
        bVar4 = (byte)uVar6;
        bVar2 = true;
      }
      else {
        if ((*(byte *)(*(long *)(uVar6 + 0x10) + 0x18) & 2) == 0) {
          local_1a = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)(uVar6 + 8);
          bVar2 = ValueType::IsInt((ValueType *)&local_1a.field_0);
          uVar6 = (ulong)bVar2;
          if (bVar2) goto LAB_00638c5c;
        }
        bVar4 = (this_00->field_0xb & 0x10) >> 4;
        bVar2 = false;
      }
      if (!bVar2) goto LAB_00638cdd;
    }
    else if (this_00 != (Opnd *)0x0) {
      OVar3 = IR::Opnd::GetKind(this_00);
      if ((OVar3 != OpndKindSym) && ((instr->m_src1->field_0xb & 0x10) != 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/TempTracker.cpp"
                           ,0x2fd,
                           "(instr->GetSrc1() == nullptr || instr->GetSrc1()->IsSymOpnd() || !instr->GetSrc1()->CanStoreTemp())"
                           ,
                           "instr->GetSrc1() == nullptr || instr->GetSrc1()->IsSymOpnd() || !instr->GetSrc1()->CanStoreTemp()"
                          );
        if (!bVar2) goto LAB_00638ce8;
        *puVar5 = 0;
      }
    }
  }
  bVar4 = 0;
LAB_00638cdd:
  return (bool)(bVar4 & 1);
}

Assistant:

bool
NumberTemp::IsTempIndirTransferLoad(IR::Instr * instr, BackwardPass * backwardPass)
{
    if (DoMarkTempNumbersOnTempObjects(backwardPass))
    {
        if (instr->m_opcode == Js::OpCode::LdElemI_A)
        {
            // If the index is an int, then we don't care about the non-temp use
            IR::Opnd * src1Opnd = instr->GetSrc1();
            IR::RegOpnd * indexOpnd = src1Opnd->AsIndirOpnd()->GetIndexOpnd();
            if (indexOpnd && (indexOpnd->m_sym->m_isNotNumber || !indexOpnd->GetValueType().IsInt()))
            {
                return src1Opnd->CanStoreTemp();
            }
        }
        else
        {
            // All other opcode shouldn't have sym opnd that can store temp, See ObjectTemp::IsTempUseOpCodeSym.
            Assert(instr->GetSrc1() == nullptr || instr->GetSrc1()->IsSymOpnd()
                || !instr->GetSrc1()->CanStoreTemp());
        }
    }
    return false;
}